

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O2

void __thiscall
gss::innards::HomomorphismModel::HomomorphismModel
          (HomomorphismModel *this,InputGraph *target,InputGraph *pattern,HomomorphismParams *params
          ,shared_ptr<gss::innards::Proof> *proof)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  anon_class_1_0_00000001 *this_00;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var11;
  iterator iVar12;
  long *plVar13;
  size_type sVar14;
  UnsupportedConfiguration *pUVar15;
  HomomorphismParams *pHVar16;
  int v;
  long lVar17;
  int iVar18;
  iterator __begin3;
  undefined8 *puVar19;
  _List_node_base *p_Var20;
  const_iterator cVar21;
  uint uVar22;
  code *pcVar23;
  ulong uVar24;
  uint j;
  uint b;
  code *pcVar25;
  undefined1 auVar26 [32];
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar27;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  allocator<char> local_179;
  anon_class_1_0_00000001 *local_178;
  int next_vertex_label;
  int next_edge_label;
  int b_decoded;
  undefined1 auStack_164 [12];
  int a_decoded;
  undefined1 auStack_144 [12];
  undefined1 auStack_140 [8];
  code *pcStack_138;
  code *pcStack_130;
  undefined8 local_128;
  undefined8 local_120;
  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  pattern_less_thans_in_wrong_order;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  edge_labels_map;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  vertex_labels_map;
  
  local_178 = (anon_class_1_0_00000001 *)target;
  _Var11._M_head_impl = (Imp *)operator_new(0x2e8);
  Imp::Imp(_Var11._M_head_impl,params,proof);
  (this->_imp)._M_t.
  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ._M_t.
  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl =
       _Var11._M_head_impl;
  bVar5 = supports_exact_path_graphs(params);
  iVar18 = params->number_of_exact_path_graphs;
  bVar6 = supports_distance2_graphs(params);
  bVar7 = supports_distance3_graphs(params);
  bVar8 = supports_k4_graphs(params);
  iVar18 = iVar18 + 1;
  if (!bVar5) {
    iVar18 = 1;
  }
  this->max_graphs =
       (uint)bVar8 + (uint)bVar7 + (uint)bVar6 + iVar18 +
       (int)(params->extra_shapes).
            super__List_base<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>,_std::allocator<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>_>_>
            ._M_impl._M_node._M_size;
  uVar9 = InputGraph::size(pattern);
  this->pattern_size = uVar9;
  uVar9 = InputGraph::size((InputGraph *)local_178);
  this->target_size = uVar9;
  auVar26 = ZEXT1632(ZEXT816(0) << 0x40);
  this->pattern_less_thans_in_convenient_order =
       (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        )auVar26._0_24_;
  (this->target_occur_less_thans_in_convenient_order).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar26._24_8_;
  *(undefined1 (*) [32])
   &(this->pattern_less_thans_in_convenient_order).
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar26;
  _Var11._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  if (*(char *)((long)(_Var11._M_head_impl)->params + 0x88) == '\x01') {
    uVar9 = 1;
    if (*(char *)((long)(_Var11._M_head_impl)->params + 0x89) != '\0') {
      uVar9 = this->max_graphs;
    }
    (_Var11._M_head_impl)->max_graphs_for_clique_size_constraints = uVar9;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&(_Var11._M_head_impl)->patterns_degrees,(ulong)this->max_graphs);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
            targets_degrees,(ulong)this->max_graphs);
  if (this->max_graphs < 9) {
    if (*(long *)&(((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                   _M_head_impl)->proof).
                  super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0) {
      iVar18 = 0;
      while( true ) {
        iVar10 = InputGraph::size(pattern);
        if (iVar10 <= iVar18) break;
        _Var11._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        InputGraph::vertex_name_abi_cxx11_((string *)&a_decoded,pattern,iVar18);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &(_Var11._M_head_impl)->pattern_vertex_proof_names,(string *)&a_decoded);
        std::__cxx11::string::~string((string *)&a_decoded);
        iVar18 = iVar18 + 1;
      }
      iVar18 = 0;
      while( true ) {
        iVar10 = InputGraph::size((InputGraph *)local_178);
        if (iVar10 <= iVar18) break;
        _Var11._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        InputGraph::vertex_name_abi_cxx11_((string *)&a_decoded,(InputGraph *)local_178,iVar18);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &(_Var11._M_head_impl)->target_vertex_proof_names,(string *)&a_decoded);
        std::__cxx11::string::~string((string *)&a_decoded);
        iVar18 = iVar18 + 1;
      }
    }
    bVar5 = InputGraph::directed(pattern);
    _Var11._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    if (bVar5) {
      (_Var11._M_head_impl)->directed = true;
    }
    uVar9 = this->max_graphs;
    uVar22 = this->pattern_size;
    SVOBitset::SVOBitset((SVOBitset *)&a_decoded,uVar22,0);
    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::resize
              (&(_Var11._M_head_impl)->pattern_graph_rows,(ulong)(uVar9 * uVar22),
               (value_type *)&a_decoded);
    SVOBitset::~SVOBitset((SVOBitset *)&a_decoded);
    std::vector<int,_std::allocator<int>_>::resize
              (&((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)
                ->pattern_loops,(ulong)this->pattern_size);
    uVar9 = this->pattern_size;
    for (pcVar23 = (code *)0x0; pcVar25 = (code *)(ulong)uVar9, pcVar23 < pcVar25;
        pcVar23 = pcVar23 + 1) {
      for (pcVar25 = (code *)0x0; uVar22 = (uint)pcVar25, uVar22 < uVar9; pcVar25 = pcVar25 + 1) {
        bVar5 = InputGraph::adjacent(pattern,(int)pcVar23,uVar22);
        if (bVar5) {
          _Var11._M_head_impl =
               (this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
          if (pcVar23 == pcVar25) {
            *(undefined4 *)
             (*(long *)&((_Var11._M_head_impl)->pattern_loops).
                        super__Vector_base<int,_std::allocator<int>_> + (long)pcVar23 * 4) = 1;
          }
          else {
            SVOBitset::set((SVOBitset *)
                           ((ulong)(this->max_graphs * (int)pcVar23) * 0x88 +
                           *(long *)&((_Var11._M_head_impl)->pattern_graph_rows).
                                     super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                           ),uVar22);
          }
        }
        uVar9 = this->pattern_size;
      }
    }
    vertex_labels_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vertex_labels_map._M_t._M_impl.super__Rb_tree_header._M_header;
    next_vertex_label = 1;
    vertex_labels_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vertex_labels_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vertex_labels_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vertex_labels_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vertex_labels_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar5 = InputGraph::has_vertex_labels(pattern);
    if (bVar5) {
      for (uVar9 = 0; uVar9 < this->pattern_size; uVar9 = uVar9 + 1) {
        _a_decoded = (undefined1  [16])InputGraph::vertex_label(pattern,uVar9);
        pVar27 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                 ::_M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>,int&>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                             *)&vertex_labels_map,
                            (basic_string_view<char,_std::char_traits<char>_> *)&a_decoded,
                            &next_vertex_label);
        if (((undefined1  [16])pVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          next_vertex_label = next_vertex_label + 1;
        }
      }
      std::vector<int,_std::allocator<int>_>::resize
                (&((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                  _M_head_impl)->pattern_vertex_labels,(ulong)this->pattern_size);
      for (uVar24 = 0; uVar24 < this->pattern_size; uVar24 = uVar24 + 1) {
        edge_labels_map._M_t._M_impl._0_16_ = InputGraph::vertex_label(pattern,(int)uVar24);
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&a_decoded,
                   (basic_string_view<char,_std::char_traits<char>_> *)&edge_labels_map,
                   (allocator<char> *)&b_decoded);
        iVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find(&vertex_labels_map._M_t,(key_type *)&a_decoded);
        pcVar25 = *(code **)&(((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                              ._M_head_impl)->pattern_vertex_labels).
                             super__Vector_base<int,_std::allocator<int>_>;
        *(_Rb_tree_color *)(pcVar25 + uVar24 * 4) = iVar12._M_node[2]._M_color;
        std::__cxx11::string::~string((string *)&a_decoded);
      }
    }
    edge_labels_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &edge_labels_map._M_t._M_impl.super__Rb_tree_header._M_header;
    next_edge_label = 1;
    edge_labels_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    edge_labels_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    edge_labels_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    edge_labels_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         edge_labels_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar5 = InputGraph::has_edge_labels(pattern);
    _Var11._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    if (bVar5) {
      std::vector<int,_std::allocator<int>_>::resize
                (&(_Var11._M_head_impl)->pattern_edge_labels,
                 (ulong)(this->pattern_size * this->pattern_size));
      uVar9 = this->pattern_size;
      for (uVar22 = 0; uVar22 < uVar9; uVar22 = uVar22 + 1) {
        for (b = 0; b < uVar9; b = b + 1) {
          bVar5 = InputGraph::adjacent(pattern,uVar22,b);
          if (bVar5) {
            _a_decoded = (undefined1  [16])InputGraph::edge_label(pattern,uVar22,b);
            pVar27 = std::
                     _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                     ::_M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>,int&>
                               ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                                 *)&edge_labels_map,
                                (basic_string_view<char,_std::char_traits<char>_> *)&a_decoded,
                                &next_edge_label);
            if (((undefined1  [16])pVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              next_edge_label = next_edge_label + 1;
            }
            pcVar25 = *(code **)&(((this->_imp)._M_t.
                                   super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                   .
                                   super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                  ._M_head_impl)->pattern_edge_labels).
                                 super__Vector_base<int,_std::allocator<int>_>;
            *(_Rb_tree_color *)(pcVar25 + (ulong)(this->pattern_size * uVar22 + b) * 4) =
                 pVar27.first._M_node._M_node[2]._M_color;
          }
          uVar9 = this->pattern_size;
        }
      }
      _Var11._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    }
    uVar9 = this->max_graphs;
    uVar22 = this->target_size;
    SVOBitset::SVOBitset((SVOBitset *)&a_decoded,uVar22,0);
    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::resize
              (&(_Var11._M_head_impl)->target_graph_rows,(ulong)(uVar9 * uVar22),
               (value_type *)&a_decoded);
    SVOBitset::~SVOBitset((SVOBitset *)&a_decoded);
    std::vector<int,_std::allocator<int>_>::resize
              (&((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)
                ->target_loops,(ulong)this->target_size);
    auStack_140 = (undefined1  [8])0x0;
    _a_decoded = this;
    pcStack_130 = std::
                  _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:221:26)>
                  ::_M_invoke;
    pcStack_138 = std::
                  _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:221:26)>
                  ::_M_manager;
    InputGraph::for_each_edge
              ((InputGraph *)local_178,
               (function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)
               &a_decoded);
    std::_Function_base::~_Function_base((_Function_base *)&a_decoded);
    bVar5 = InputGraph::directed(pattern);
    if (bVar5) {
      _Var11._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      uVar9 = this->target_size;
      SVOBitset::SVOBitset((SVOBitset *)&a_decoded,uVar9,0);
      std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::resize
                (&(_Var11._M_head_impl)->forward_target_graph_rows,(ulong)uVar9,
                 (value_type *)&a_decoded);
      SVOBitset::~SVOBitset((SVOBitset *)&a_decoded);
      _Var11._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      uVar9 = this->target_size;
      SVOBitset::SVOBitset((SVOBitset *)&a_decoded,uVar9,0);
      std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::resize
                (&(_Var11._M_head_impl)->reverse_target_graph_rows,(ulong)uVar9,
                 (value_type *)&a_decoded);
      SVOBitset::~SVOBitset((SVOBitset *)&a_decoded);
      auStack_140 = (undefined1  [8])0x0;
      pcStack_130 = std::
                    _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:232:30)>
                    ::_M_invoke;
      pcStack_138 = std::
                    _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:232:30)>
                    ::_M_manager;
      InputGraph::for_each_edge
                ((InputGraph *)local_178,
                 (function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)> *
                 )&a_decoded);
      std::_Function_base::~_Function_base((_Function_base *)&a_decoded);
    }
    bVar5 = InputGraph::has_vertex_labels(pattern);
    if (bVar5) {
      for (uVar9 = 0; uVar9 < this->target_size; uVar9 = uVar9 + 1) {
        _a_decoded = (undefined1  [16])InputGraph::vertex_label((InputGraph *)local_178,uVar9);
        pVar27 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                 ::_M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>,int&>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                             *)&vertex_labels_map,
                            (basic_string_view<char,_std::char_traits<char>_> *)&a_decoded,
                            &next_vertex_label);
        if (((undefined1  [16])pVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          next_vertex_label = next_vertex_label + 1;
        }
      }
      std::vector<int,_std::allocator<int>_>::resize
                (&((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                  _M_head_impl)->target_vertex_labels,(ulong)this->target_size);
      for (uVar24 = 0; uVar24 < this->target_size; uVar24 = uVar24 + 1) {
        _b_decoded = InputGraph::vertex_label((InputGraph *)local_178,(int)uVar24);
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&a_decoded,
                   (basic_string_view<char,_std::char_traits<char>_> *)&b_decoded,
                   (allocator<char> *)&pattern_less_thans_in_wrong_order);
        iVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find(&vertex_labels_map._M_t,(key_type *)&a_decoded);
        pcVar25 = *(code **)&(((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                              ._M_head_impl)->target_vertex_labels).
                             super__Vector_base<int,_std::allocator<int>_>;
        *(_Rb_tree_color *)(pcVar25 + uVar24 * 4) = iVar12._M_node[2]._M_color;
        std::__cxx11::string::~string((string *)&a_decoded);
      }
    }
    bVar5 = InputGraph::has_edge_labels(pattern);
    if (bVar5) {
      std::vector<int,_std::allocator<int>_>::resize
                (&((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                  _M_head_impl)->target_edge_labels,(ulong)(this->target_size * this->target_size));
      _a_decoded = ZEXT816(0);
      pcStack_138 = (code *)0x0;
      pcStack_130 = (code *)0x0;
      plVar13 = (long *)operator_new(0x18);
      *plVar13 = (long)&edge_labels_map;
      plVar13[1] = (long)&next_edge_label;
      pcVar25 = std::
                _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:255:30)>
                ::_M_manager;
      _a_decoded = plVar13;
      plVar13[2] = (long)this;
      pcStack_130 = std::
                    _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:255:30)>
                    ::_M_invoke;
      pcStack_138 = std::
                    _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:255:30)>
                    ::_M_manager;
      InputGraph::for_each_edge
                ((InputGraph *)local_178,
                 (function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)> *
                 )&a_decoded);
      std::_Function_base::~_Function_base((_Function_base *)&a_decoded);
    }
    _Var11._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    lVar17 = (long)(_Var11._M_head_impl)->params;
    puVar19 = *(undefined8 **)(lVar17 + 0x90);
    if (puVar19 != (undefined8 *)(lVar17 + 0x90)) {
      (_Var11._M_head_impl)->has_less_thans = true;
      pattern_less_thans_in_wrong_order.
      super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl._M_node._M_size = 0;
      pattern_less_thans_in_wrong_order.
      super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)&pattern_less_thans_in_wrong_order;
      pattern_less_thans_in_wrong_order.
      super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           (_List_node_base *)&pattern_less_thans_in_wrong_order;
      for (; puVar19 != (undefined8 *)(lVar17 + 0x90); puVar19 = (undefined8 *)*puVar19) {
        s._M_str = (char *)pcVar25;
        s._M_len = puVar19[2];
        iVar18 = HomomorphismModel::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)pattern,(InputGraph *)puVar19[3],s);
        a_decoded = iVar18;
        s_00._M_str = (char *)pcVar25;
        s_00._M_len = puVar19[6];
        iVar18 = HomomorphismModel::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)pattern,(InputGraph *)puVar19[7],s_00);
        b_decoded = iVar18;
        std::__cxx11::
        list<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::emplace_back<int&,int&>
                  ((list<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                    *)&pattern_less_thans_in_wrong_order,&a_decoded,&b_decoded);
      }
      while (pattern_less_thans_in_wrong_order.
             super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl._M_node.super__List_node_base._M_next !=
             (_List_node_base *)&pattern_less_thans_in_wrong_order) {
        pcStack_130 = (code *)auStack_140;
        auStack_140._0_4_ = 0;
        pcStack_138 = (code *)0x0;
        local_120 = 0;
        local_128 = pcStack_130;
        for (p_Var20 = pattern_less_thans_in_wrong_order.
                       super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next;
            p_Var20 != (_List_node_base *)&pattern_less_thans_in_wrong_order;
            p_Var20 = p_Var20->_M_next) {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_emplace_unique<unsigned_int&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&a_decoded,(uint *)((long)&p_Var20[1]._M_next + 4));
        }
        bVar5 = true;
        cVar21._M_node =
             pattern_less_thans_in_wrong_order.
             super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
        while (cVar21._M_node != (_List_node_base *)&pattern_less_thans_in_wrong_order) {
          sVar14 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                   count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&a_decoded,(key_type_conflict *)(cVar21._M_node + 1));
          if (sVar14 == 0) {
            std::
            vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ::push_back(&this->pattern_less_thans_in_convenient_order,
                        (value_type *)(cVar21._M_node + 1));
            p_Var20 = (cVar21._M_node)->_M_next;
            std::__cxx11::
            list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ::erase(&pattern_less_thans_in_wrong_order,cVar21);
            bVar5 = false;
            cVar21._M_node = p_Var20;
          }
          else {
            cVar21._M_node = (cVar21._M_node)->_M_next;
          }
        }
        if (bVar5) {
          pUVar15 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&b_decoded,"Pattern less than constraints form a loop",&local_179);
          UnsupportedConfiguration::UnsupportedConfiguration(pUVar15,(string *)&b_decoded);
          __cxa_throw(pUVar15,&UnsupportedConfiguration::typeinfo,
                      UnsupportedConfiguration::~UnsupportedConfiguration);
        }
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&a_decoded);
      }
      std::__cxx11::
      _List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::_M_clear(&pattern_less_thans_in_wrong_order.
                  super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                );
      _Var11._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      lVar17 = (long)(_Var11._M_head_impl)->params;
    }
    this_00 = local_178;
    puVar19 = *(undefined8 **)(lVar17 + 0xa8);
    if (puVar19 != (undefined8 *)(lVar17 + 0xa8)) {
      (_Var11._M_head_impl)->has_occur_less_thans = true;
      pattern_less_thans_in_wrong_order.
      super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl._M_node._M_size = 0;
      pHVar16 = params;
      pattern_less_thans_in_wrong_order.
      super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)&pattern_less_thans_in_wrong_order;
      pattern_less_thans_in_wrong_order.
      super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           (_List_node_base *)&pattern_less_thans_in_wrong_order;
      for (; puVar19 != (undefined8 *)(lVar17 + 0xa8); puVar19 = (undefined8 *)*puVar19) {
        s_01._M_str = (char *)pHVar16;
        s_01._M_len = puVar19[2];
        iVar18 = HomomorphismModel::anon_class_1_0_00000001::operator()
                           (this_00,(InputGraph *)puVar19[3],s_01);
        a_decoded = iVar18;
        s_02._M_str = (char *)pHVar16;
        s_02._M_len = puVar19[6];
        iVar18 = HomomorphismModel::anon_class_1_0_00000001::operator()
                           (this_00,(InputGraph *)puVar19[7],s_02);
        b_decoded = iVar18;
        std::__cxx11::
        list<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::emplace_back<int&,int&>
                  ((list<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                    *)&pattern_less_thans_in_wrong_order,&a_decoded,&b_decoded);
      }
      while (pattern_less_thans_in_wrong_order.
             super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl._M_node.super__List_node_base._M_next !=
             (_List_node_base *)&pattern_less_thans_in_wrong_order) {
        pcStack_130 = (code *)auStack_140;
        auStack_140._0_4_ = 0;
        pcStack_138 = (code *)0x0;
        local_120 = 0;
        local_128 = pcStack_130;
        for (p_Var20 = pattern_less_thans_in_wrong_order.
                       super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next;
            p_Var20 != (_List_node_base *)&pattern_less_thans_in_wrong_order;
            p_Var20 = p_Var20->_M_next) {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_emplace_unique<unsigned_int&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&a_decoded,(uint *)((long)&p_Var20[1]._M_next + 4));
        }
        bVar5 = true;
        cVar21._M_node =
             pattern_less_thans_in_wrong_order.
             super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
        while (cVar21._M_node != (_List_node_base *)&pattern_less_thans_in_wrong_order) {
          sVar14 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                   count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&a_decoded,(key_type_conflict *)(cVar21._M_node + 1));
          if (sVar14 == 0) {
            std::
            vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ::push_back(&this->target_occur_less_thans_in_convenient_order,
                        (value_type *)(cVar21._M_node + 1));
            p_Var20 = (cVar21._M_node)->_M_next;
            std::__cxx11::
            list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ::erase(&pattern_less_thans_in_wrong_order,cVar21);
            bVar5 = false;
            cVar21._M_node = p_Var20;
          }
          else {
            cVar21._M_node = (cVar21._M_node)->_M_next;
          }
        }
        if (bVar5) {
          pUVar15 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&b_decoded,"Target less than constraints form a loop",&local_179);
          UnsupportedConfiguration::UnsupportedConfiguration(pUVar15,(string *)&b_decoded);
          __cxa_throw(pUVar15,&UnsupportedConfiguration::typeinfo,
                      UnsupportedConfiguration::~UnsupportedConfiguration);
        }
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&a_decoded);
      }
      std::__cxx11::
      _List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::_M_clear(&pattern_less_thans_in_wrong_order.
                  super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                );
    }
    if (params->clique_size_constraints == true) {
      uVar9 = 0;
      while( true ) {
        _Var11._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        if ((_Var11._M_head_impl)->max_graphs_for_clique_size_constraints <= uVar9) break;
        iVar18 = InputGraph::size(pattern);
        auVar1._12_4_ = 0;
        auVar1._0_12_ = auStack_164;
        _b_decoded = (string_view)(auVar1 << 0x20);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&a_decoded,(long)iVar18,&b_decoded,
                   (allocator_type *)&pattern_less_thans_in_wrong_order);
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&(_Var11._M_head_impl)->pattern_cliques_sizes,
                   (vector<int,_std::allocator<int>_> *)&a_decoded);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&a_decoded);
        _Var11._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        iVar18 = InputGraph::size((InputGraph *)local_178);
        auVar2._12_4_ = 0;
        auVar2._0_12_ = auStack_164;
        _b_decoded = (string_view)(auVar2 << 0x20);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&a_decoded,(long)iVar18,&b_decoded,
                   (allocator_type *)&pattern_less_thans_in_wrong_order);
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&(_Var11._M_head_impl)->target_cliques_sizes,
                   (vector<int,_std::allocator<int>_> *)&a_decoded);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&a_decoded);
        _Var11._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        iVar18 = InputGraph::size(pattern);
        auVar3._12_4_ = 0;
        auVar3._0_12_ = auStack_164;
        _b_decoded = (string_view)(auVar3 << 0x20);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&a_decoded,(long)iVar18,&b_decoded,
                   (allocator_type *)&pattern_less_thans_in_wrong_order);
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&(_Var11._M_head_impl)->pattern_cliques_best_knowns,
                   (vector<int,_std::allocator<int>_> *)&a_decoded);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&a_decoded);
        _Var11._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        iVar18 = InputGraph::size((InputGraph *)local_178);
        auVar4._12_4_ = 0;
        auVar4._0_12_ = auStack_164;
        _b_decoded = (string_view)(auVar4 << 0x20);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&a_decoded,(long)iVar18,&b_decoded,
                   (allocator_type *)&pattern_less_thans_in_wrong_order);
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&(_Var11._M_head_impl)->target_cliques_best_knowns,
                   (vector<int,_std::allocator<int>_> *)&a_decoded);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&a_decoded);
        uVar9 = uVar9 + 1;
      }
      std::vector<int,_std::allocator<int>_>::resize
                (&(_Var11._M_head_impl)->largest_pattern_clique,
                 (ulong)(_Var11._M_head_impl)->max_graphs_for_clique_size_constraints);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(&edge_labels_map._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(&vertex_labels_map._M_t);
    return;
  }
  pUVar15 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a_decoded,"Supplemental graphs won\'t fit in the chosen bitset size",
             (allocator<char> *)&vertex_labels_map);
  UnsupportedConfiguration::UnsupportedConfiguration(pUVar15,(string *)&a_decoded);
  __cxa_throw(pUVar15,&UnsupportedConfiguration::typeinfo,
              UnsupportedConfiguration::~UnsupportedConfiguration);
}

Assistant:

HomomorphismModel::HomomorphismModel(const InputGraph & target, const InputGraph & pattern, const HomomorphismParams & params,
    const std::shared_ptr<Proof> & proof) :
    _imp(new Imp(params, proof)),
    max_graphs(calculate_n_shape_graphs(params)),
    pattern_size(pattern.size()),
    target_size(target.size())
{
    if (_imp->params.clique_size_constraints)
        _imp->max_graphs_for_clique_size_constraints = (_imp->params.clique_size_constraints_on_supplementals ? max_graphs : 1);

    _imp->patterns_degrees.resize(max_graphs);
    _imp->targets_degrees.resize(max_graphs);

    if (max_graphs > 8 * sizeof(PatternAdjacencyBitsType))
        throw UnsupportedConfiguration{"Supplemental graphs won't fit in the chosen bitset size"};

    if (_imp->proof) {
        for (int v = 0; v < pattern.size(); ++v)
            _imp->pattern_vertex_proof_names.push_back(pattern.vertex_name(v));
        for (int v = 0; v < target.size(); ++v)
            _imp->target_vertex_proof_names.push_back(target.vertex_name(v));
    }

    if (pattern.directed())
        _imp->directed = true;

    // recode pattern to a bit graph, and strip out loops
    _imp->pattern_graph_rows.resize(pattern_size * max_graphs, SVOBitset(pattern_size, 0));
    _imp->pattern_loops.resize(pattern_size);
    for (unsigned i = 0; i < pattern_size; ++i) {
        for (unsigned j = 0; j < pattern_size; ++j) {
            if (pattern.adjacent(i, j)) {
                if (i == j)
                    _imp->pattern_loops[i] = 1;
                else
                    _imp->pattern_graph_rows[i * max_graphs + 0].set(j);
            }
        }
    }

    // re-encode and store pattern labels
    map<string, int> vertex_labels_map;
    int next_vertex_label = 1;
    if (pattern.has_vertex_labels()) {
        for (unsigned i = 0; i < pattern_size; ++i) {
            if (vertex_labels_map.emplace(pattern.vertex_label(i), next_vertex_label).second)
                ++next_vertex_label;
        }

        _imp->pattern_vertex_labels.resize(pattern_size);
        for (unsigned i = 0; i < pattern_size; ++i)
            _imp->pattern_vertex_labels[i] = vertex_labels_map.find(string{pattern.vertex_label(i)})->second;
    }

    // re-encode and store edge labels
    map<string, int> edge_labels_map;
    int next_edge_label = 1;
    if (pattern.has_edge_labels()) {
        _imp->pattern_edge_labels.resize(pattern_size * pattern_size);
        for (unsigned i = 0; i < pattern_size; ++i)
            for (unsigned j = 0; j < pattern_size; ++j)
                if (pattern.adjacent(i, j)) {
                    auto r = edge_labels_map.emplace(pattern.edge_label(i, j), next_edge_label);
                    if (r.second)
                        ++next_edge_label;
                    _imp->pattern_edge_labels[i * pattern_size + j] = r.first->second;
                }
    }

    // recode target to a bit graph, and take out loops
    _imp->target_graph_rows.resize(target_size * max_graphs, SVOBitset{target_size, 0});
    _imp->target_loops.resize(target_size);
    target.for_each_edge([&](int f, int t, string_view) {
        if (f == t)
            _imp->target_loops[f] = 1;
        else
            _imp->target_graph_rows[f * max_graphs + 0].set(t);
    });

    // if directed, do both directions
    if (pattern.directed()) {
        _imp->forward_target_graph_rows.resize(target_size, SVOBitset{target_size, 0});
        _imp->reverse_target_graph_rows.resize(target_size, SVOBitset{target_size, 0});
        target.for_each_edge([&](int f, int t, string_view l) {
            if (f != t && l != "unlabelled") {
                _imp->forward_target_graph_rows[f].set(t);
                _imp->reverse_target_graph_rows[t].set(f);
            }
        });
    }

    // target vertex labels
    if (pattern.has_vertex_labels()) {
        for (unsigned i = 0; i < target_size; ++i) {
            if (vertex_labels_map.emplace(target.vertex_label(i), next_vertex_label).second)
                ++next_vertex_label;
        }

        _imp->target_vertex_labels.resize(target_size);
        for (unsigned i = 0; i < target_size; ++i)
            _imp->target_vertex_labels[i] = vertex_labels_map.find(string{target.vertex_label(i)})->second;
    }

    // target edge labels
    if (pattern.has_edge_labels()) {
        _imp->target_edge_labels.resize(target_size * target_size);
        target.for_each_edge([&](int f, int t, string_view l) {
            auto r = edge_labels_map.emplace(l, next_edge_label);
            if (r.second)
                ++next_edge_label;

            _imp->target_edge_labels[f * target_size + t] = r.first->second;
        });
    }

    auto decode = [&](const InputGraph & g, string_view s) -> int {
        auto n = g.vertex_from_name(s);
        if (! n)
            throw UnsupportedConfiguration{"No vertex named '" + string{s} + "'"};
        return *n;
    };

    // pattern less than constraints
    if (! _imp->params.pattern_less_constraints.empty()) {
        _imp->has_less_thans = true;
        list<pair<unsigned, unsigned>> pattern_less_thans_in_wrong_order;
        for (auto & [a, b] : _imp->params.pattern_less_constraints) {
            auto a_decoded = decode(pattern, a), b_decoded = decode(pattern, b);
            pattern_less_thans_in_wrong_order.emplace_back(a_decoded, b_decoded);
        }

        // put them in a convenient order, so we don't need a propagation loop
        while (! pattern_less_thans_in_wrong_order.empty()) {
            bool loop_detect = true;
            set<unsigned> cannot_order_yet;
            for (auto & [_, b] : pattern_less_thans_in_wrong_order)
                cannot_order_yet.emplace(b);
            for (auto p = pattern_less_thans_in_wrong_order.begin(); p != pattern_less_thans_in_wrong_order.end();) {
                if (cannot_order_yet.count(p->first))
                    ++p;
                else {
                    loop_detect = false;
                    pattern_less_thans_in_convenient_order.push_back(*p);
                    pattern_less_thans_in_wrong_order.erase(p++);
                }
            }

            if (loop_detect)
                throw UnsupportedConfiguration{"Pattern less than constraints form a loop"};
        }
    }

    // target less than constraints
    if (! _imp->params.target_occur_less_constraints.empty()) {
        _imp->has_occur_less_thans = true;
        list<pair<unsigned, unsigned>> target_occur_less_thans_in_wrong_order;
        for (auto & [a, b] : _imp->params.target_occur_less_constraints) {
            auto a_decoded = decode(target, a), b_decoded = decode(target, b);
            target_occur_less_thans_in_wrong_order.emplace_back(a_decoded, b_decoded);
        }

        // put them in a convenient order, so we don't need a propagation loop
        while (! target_occur_less_thans_in_wrong_order.empty()) {
            bool loop_detect = true;
            set<unsigned> cannot_order_yet;
            for (auto & [_, b] : target_occur_less_thans_in_wrong_order)
                cannot_order_yet.emplace(b);
            for (auto t = target_occur_less_thans_in_wrong_order.begin(); t != target_occur_less_thans_in_wrong_order.end();) {
                if (cannot_order_yet.count(t->first))
                    ++t;
                else {
                    loop_detect = false;
                    target_occur_less_thans_in_convenient_order.push_back(*t);
                    target_occur_less_thans_in_wrong_order.erase(t++);
                }
            }

            if (loop_detect)
                throw UnsupportedConfiguration{"Target less than constraints form a loop"};
        }
    }

    // make space for clique constraints
    if (params.clique_size_constraints) {
        for (unsigned g = 0; g < _imp->max_graphs_for_clique_size_constraints; ++g) {
            _imp->pattern_cliques_sizes.push_back(vector<int>(pattern.size(), 0));
            _imp->target_cliques_sizes.push_back(vector<int>(target.size(), 0));
            _imp->pattern_cliques_best_knowns.push_back(vector<int>(pattern.size(), 0));
            _imp->target_cliques_best_knowns.push_back(vector<int>(target.size(), 0));
        }
        _imp->largest_pattern_clique.resize(_imp->max_graphs_for_clique_size_constraints);
    }
}